

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

int __thiscall pbrt::SDVertex::valence(SDVertex *this)

{
  SDFace *pSVar1;
  SDVertex *in_RDI;
  int nf_1;
  int nf;
  SDFace *f;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if ((in_RDI->boundary & 1U) == 0) {
    local_4 = 1;
    while (pSVar1 = SDFace::nextFace((SDFace *)CONCAT44(local_4,in_stack_ffffffffffffffe0),in_RDI),
          pSVar1 != in_RDI->startFace) {
      local_4 = local_4 + 1;
    }
  }
  else {
    local_4 = 1;
    while (pSVar1 = SDFace::nextFace((SDFace *)CONCAT44(in_stack_ffffffffffffffe4,local_4),in_RDI),
          pSVar1 != (SDFace *)0x0) {
      local_4 = local_4 + 1;
    }
    while (pSVar1 = SDFace::prevFace((SDFace *)CONCAT44(in_stack_ffffffffffffffe4,local_4),in_RDI),
          pSVar1 != (SDFace *)0x0) {
      local_4 = local_4 + 1;
    }
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

inline int SDVertex::valence() {
    SDFace *f = startFace;
    if (!boundary) {
        // Compute valence of interior vertex
        int nf = 1;
        while ((f = f->nextFace(this)) != startFace)
            ++nf;
        return nf;
    } else {
        // Compute valence of boundary vertex
        int nf = 1;
        while ((f = f->nextFace(this)) != nullptr)
            ++nf;
        f = startFace;
        while ((f = f->prevFace(this)) != nullptr)
            ++nf;
        return nf + 1;
    }
}